

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O3

bool __thiscall
llbuild::buildsystem::ExternalCommand::canUpdateIfNewerWithResult
          (ExternalCommand *this,BuildValue *result)

{
  uint32_t uVar1;
  bool bVar2;
  FileInfo *this_00;
  uint n;
  bool bVar3;
  
  if (this->allowModifiedOutputs == true) {
    if ((SuccessfulCommandWithOutputSignature < result->kind) ||
       ((0x20414U >> (result->kind & (FilteredDirectoryContents|Target)) & 1) == 0)) {
      __assert_fail("kindHasOutputInfo() && \"invalid call for value kind\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                    ,0x186,"unsigned int llbuild::buildsystem::BuildValue::getNumOutputs() const");
    }
    uVar1 = result->numOutputInfos;
    if (uVar1 == 0) {
      bVar2 = true;
    }
    else {
      n = 0;
      do {
        this_00 = BuildValue::getNthOutputInfo(result,n);
        bVar2 = basic::FileInfo::isMissing(this_00);
        if (bVar2) break;
        bVar3 = uVar1 - 1 != n;
        n = n + 1;
      } while (bVar3);
      bVar2 = !bVar2;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ExternalCommand::canUpdateIfNewerWithResult(const BuildValue& result) {
  // Unless `allowModifiedOutputs` is specified, we always need to update if
  // ran.
  if (!allowModifiedOutputs)
    return false;

  // If it was specified, then we can update if all of our outputs simply exist.
  for (unsigned i = 0, e = result.getNumOutputs(); i != e; ++i) {
    const FileInfo& outputInfo = result.getNthOutputInfo(i);

    // If the output is missing, we need to rebuild.
    if (outputInfo.isMissing())
      return false;
  }
  return true;
}